

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O2

spectral_operation __thiscall kitty::detail::spectrum::disjoint_translation(spectrum *this,int i)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  spectral_operation sVar4;
  uint uVar5;
  ulong uVar6;
  
  piVar2 = (this->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (this->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < (ulong)((long)piVar3 - (long)piVar2 >> 2);
      uVar5 = uVar5 + 1) {
    if ((uVar5 & i) != 0) {
      iVar1 = piVar2[uVar6];
      piVar2[uVar6] = piVar2[uVar5 - i];
      piVar2[uVar5 - i] = iVar1;
    }
  }
  sVar4._0_4_ = i << 0x10 | 5;
  sVar4._var2 = 0;
  return sVar4;
}

Assistant:

auto disjoint_translation( int i )
  {
    spectral_operation op( spectral_operation::kind::disjoint_translation, i );

    for ( auto k = 0u; k < _s.size(); ++k )
    {
      if ( ( k & i ) > 0 )
      {
        std::swap( _s[k], _s[k - i] );
      }
    }

    return op;
  }